

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,true>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint uVar1;
  unsigned_long *puVar2;
  Interval *pIVar3;
  int64_t iVar4;
  timestamp_t tVar5;
  Interval *pIVar6;
  timestamp_t *ptVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  idx_t iVar14;
  ulong uVar15;
  interval_t iVar16;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  interval_t interval;
  interval_t interval_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  Interval *extraout_RDX_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar3 = *(Interval **)rdata;
      iVar4 = rdata->micros;
      iVar14 = 0;
      pIVar6 = pIVar3;
      do {
        uVar1 = ldata[iVar14].days;
        iVar16.micros = (int64_t)pIVar6;
        iVar16._0_8_ = iVar4;
        iVar8 = count;
        iVar16 = Interval::Invert(pIVar3,iVar16);
        right_01._0_8_ = iVar16.micros;
        right_01.micros = iVar8;
        tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)uVar1,(date_t)iVar16.months,right_01);
        result_data[iVar14].value = tVar5.value;
        iVar14 = iVar14 + 1;
        pIVar6 = extraout_RDX_01;
      } while (count != iVar14);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    uVar13 = 0;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar12 = 0xffffffffffffffff;
      }
      else {
        uVar12 = puVar2[uVar10];
      }
      uVar11 = uVar13 + 0x40;
      if (count <= uVar13 + 0x40) {
        uVar11 = count;
      }
      uVar9 = uVar11;
      if (uVar12 != 0) {
        uVar9 = uVar13;
        if (uVar12 == 0xffffffffffffffff) {
          if (uVar13 < uVar11) {
            pIVar3 = *(Interval **)rdata;
            iVar4 = rdata->micros;
            pIVar6 = pIVar3;
            uVar15 = uVar10;
            do {
              uVar1 = ldata[uVar13].days;
              interval.micros = uVar15;
              interval._0_8_ = iVar4;
              iVar16 = Interval::Invert(pIVar3,interval);
              right._0_8_ = iVar16.micros;
              right.micros = (int64_t)pIVar6;
              tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)uVar1,(date_t)iVar16.months,right);
              result_data[uVar13].value = tVar5.value;
              uVar13 = uVar13 + 1;
              uVar15 = extraout_RDX;
              uVar9 = uVar13;
            } while (uVar11 != uVar13);
          }
        }
        else if (uVar13 < uVar11) {
          uVar15 = 0;
          ptVar7 = (timestamp_t *)count;
          uVar9 = uVar10;
          do {
            if ((uVar12 >> (uVar15 & 0x3f) & 1) != 0) {
              uVar1 = ldata[uVar13 + uVar15].days;
              interval_00.micros = uVar9;
              interval_00._0_8_ = rdata->micros;
              iVar16 = Interval::Invert(*(Interval **)rdata,interval_00);
              right_00._0_8_ = iVar16.micros;
              right_00.micros = (int64_t)ptVar7;
              tVar5 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)uVar1,(date_t)iVar16.months,right_00);
              (result_data + uVar13)[uVar15].value = tVar5.value;
              ptVar7 = result_data + uVar13;
              uVar9 = extraout_RDX_00;
            }
            uVar15 = uVar15 + 1;
          } while ((uVar13 - uVar11) + uVar15 != 0);
          uVar9 = uVar13 + uVar15;
        }
      }
      uVar10 = uVar10 + 1;
      uVar13 = uVar9;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}